

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall
V2DCFilter::renderStereo(V2DCFilter *this,StereoSample *dest,StereoSample *src,int nsamples)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = (this->fl).xm1;
  fVar4 = (this->fl).ym1;
  fVar8 = (this->fr).xm1;
  fVar3 = (this->fr).ym1;
  if (0 < nsamples) {
    fVar1 = this->inst->SRfcdcfilter;
    uVar2 = 0;
    fVar5 = fVar8;
    fVar7 = fVar6;
    do {
      fVar6 = src[uVar2].field_0.l;
      fVar4 = ((fVar4 * fVar1 + 3.8146973e-06) - fVar7) + fVar6 + -3.8146973e-06;
      dest[uVar2].field_0.l = fVar4;
      fVar8 = *(float *)((long)src + uVar2 * 8 + 4);
      fVar3 = ((fVar3 * fVar1 + 3.8146973e-06) - fVar5) + fVar8 + -3.8146973e-06;
      *(float *)((long)dest + uVar2 * 8 + 4) = fVar3;
      uVar2 = uVar2 + 1;
      fVar5 = fVar8;
      fVar7 = fVar6;
    } while ((uint)nsamples != uVar2);
  }
  (this->fl).xm1 = fVar6;
  (this->fl).ym1 = fVar4;
  (this->fr).xm1 = fVar8;
  (this->fr).ym1 = fVar3;
  return;
}

Assistant:

void renderStereo(StereoSample *dest, const StereoSample *src, int nsamples)
    {
        float R = inst->SRfcdcfilter;

        V2DCF l = fl;
        V2DCF r = fr;
        for (int i=0; i < nsamples; i++)
        {
            dest[i].l = l.step(src[i].l, R);
            dest[i].r = r.step(src[i].r, R);
        }
        fl = l;
        fr = r;
    }